

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct8x8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  undefined1 auVar14 [16];
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar25;
  int iVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  int iVar28;
  int iVar31;
  int iVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar33;
  int iVar34;
  int iVar36;
  int iVar37;
  undefined1 auVar35 [16];
  int iVar38;
  int iVar39;
  int iVar41;
  int iVar42;
  undefined1 auVar40 [16];
  int iVar43;
  int iVar44;
  int iVar46;
  int iVar47;
  undefined1 in_XMM12 [16];
  undefined1 auVar45 [16];
  int iVar48;
  int iVar49;
  uint uVar50;
  int iVar53;
  int iVar55;
  undefined1 auVar51 [16];
  uint uVar54;
  uint uVar56;
  int iVar57;
  uint uVar58;
  undefined1 auVar52 [16];
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  uint uVar65;
  int iVar67;
  int iVar68;
  uint uVar69;
  int iVar70;
  int iVar71;
  uint uVar72;
  undefined1 auVar66 [16];
  int iVar73;
  int iVar74;
  uint uVar75;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  iVar9 = do_cols + 6 + (uint)(bit == 0) * 2;
  iVar7 = 0x8000;
  if (0xf < iVar9) {
    iVar7 = 1 << ((char)iVar9 - 1U & 0x1f);
  }
  iVar9 = -iVar7;
  iVar7 = iVar7 + -1;
  lVar8 = 0;
  auVar45 = pmovsxwd(in_XMM12,0x800080008000800);
  do {
    auVar40 = *(undefined1 (*) [16])((long)in[0xc] + lVar8);
    auVar10 = *(undefined1 (*) [16])((long)in[2] + lVar8);
    auVar2 = *(undefined1 (*) [16])((long)in[4] + lVar8);
    auVar11 = *(undefined1 (*) [16])((long)in[6] + lVar8);
    auVar66 = *(undefined1 (*) [16])((long)in[10] + lVar8);
    auVar5._8_4_ = 799;
    auVar5._0_8_ = 0x31f0000031f;
    auVar5._12_4_ = 799;
    auVar29 = pmulld(auVar10,auVar5);
    auVar24 = *(undefined1 (*) [16])((long)in[0xe] + lVar8);
    auVar51._8_4_ = 0xfffff04f;
    auVar51._0_8_ = 0xfffff04ffffff04f;
    auVar51._12_4_ = 0xfffff04f;
    auVar14 = pmulld(auVar24,auVar51);
    auVar23._8_4_ = 0xfb1;
    auVar23._0_8_ = 0xfb100000fb1;
    auVar23._12_4_ = 0xfb1;
    auVar22 = pmulld(auVar10,auVar23);
    auVar51 = pmulld(auVar24,auVar5);
    auVar10._8_4_ = 0xd4e;
    auVar10._0_8_ = 0xd4e00000d4e;
    auVar10._12_4_ = 0xd4e;
    auVar23 = pmulld(auVar66,auVar10);
    auVar30._8_4_ = 0xfffff71c;
    auVar30._0_8_ = 0xfffff71cfffff71c;
    auVar30._12_4_ = 0xfffff71c;
    auVar30 = pmulld(auVar11,auVar30);
    auVar35._8_4_ = 0x8e4;
    auVar35._0_8_ = 0x8e4000008e4;
    auVar35._12_4_ = 0x8e4;
    auVar10 = pmulld(auVar66,auVar35);
    auVar66._8_4_ = 0xd4e;
    auVar66._0_8_ = 0xd4e00000d4e;
    auVar66._12_4_ = 0xd4e;
    auVar35 = pmulld(auVar11,auVar66);
    auVar11._8_4_ = 0xb50;
    auVar11._0_8_ = 0xb5000000b50;
    auVar11._12_4_ = 0xb50;
    auVar66 = pmulld(*(undefined1 (*) [16])((long)*in + lVar8),auVar11);
    auVar24._8_4_ = 0xb50;
    auVar24._0_8_ = 0xb5000000b50;
    auVar24._12_4_ = 0xb50;
    auVar11 = pmulld(*(undefined1 (*) [16])((long)in[8] + lVar8),auVar24);
    iVar44 = auVar45._0_4_;
    iVar63 = auVar66._0_4_ + iVar44;
    iVar46 = auVar45._4_4_;
    iVar67 = auVar66._4_4_ + iVar46;
    iVar47 = auVar45._8_4_;
    iVar70 = auVar66._8_4_ + iVar47;
    iVar48 = auVar45._12_4_;
    iVar73 = auVar66._12_4_ + iVar48;
    auVar3._8_4_ = 0x61f;
    auVar3._0_8_ = 0x61f0000061f;
    auVar3._12_4_ = 0x61f;
    auVar66 = pmulld(auVar2,auVar3);
    auVar4._8_4_ = 0xfffff138;
    auVar4._0_8_ = 0xfffff138fffff138;
    auVar4._12_4_ = 0xfffff138;
    auVar24 = pmulld(auVar40,auVar4);
    iVar12 = auVar14._0_4_ + auVar29._0_4_ + iVar44 >> 0xc;
    iVar15 = auVar14._4_4_ + auVar29._4_4_ + iVar46 >> 0xc;
    iVar17 = auVar14._8_4_ + auVar29._8_4_ + iVar47 >> 0xc;
    iVar19 = auVar14._12_4_ + auVar29._12_4_ + iVar48 >> 0xc;
    iVar49 = auVar51._0_4_ + auVar22._0_4_ + iVar44 >> 0xc;
    iVar53 = auVar51._4_4_ + auVar22._4_4_ + iVar46 >> 0xc;
    iVar55 = auVar51._8_4_ + auVar22._8_4_ + iVar47 >> 0xc;
    iVar57 = auVar51._12_4_ + auVar22._12_4_ + iVar48 >> 0xc;
    iVar28 = auVar30._0_4_ + auVar23._0_4_ + iVar44 >> 0xc;
    iVar31 = auVar30._4_4_ + auVar23._4_4_ + iVar46 >> 0xc;
    iVar32 = auVar30._8_4_ + auVar23._8_4_ + iVar47 >> 0xc;
    iVar33 = auVar30._12_4_ + auVar23._12_4_ + iVar48 >> 0xc;
    iVar34 = auVar35._0_4_ + auVar10._0_4_ + iVar44 >> 0xc;
    iVar36 = auVar35._4_4_ + auVar10._4_4_ + iVar46 >> 0xc;
    iVar37 = auVar35._8_4_ + auVar10._8_4_ + iVar47 >> 0xc;
    iVar38 = auVar35._12_4_ + auVar10._12_4_ + iVar48 >> 0xc;
    iVar59 = iVar63 + auVar11._0_4_ >> 0xc;
    iVar60 = iVar67 + auVar11._4_4_ >> 0xc;
    iVar61 = iVar70 + auVar11._8_4_ >> 0xc;
    iVar62 = iVar73 + auVar11._12_4_ >> 0xc;
    iVar64 = iVar63 - auVar11._0_4_ >> 0xc;
    iVar68 = iVar67 - auVar11._4_4_ >> 0xc;
    iVar71 = iVar70 - auVar11._8_4_ >> 0xc;
    iVar74 = iVar73 - auVar11._12_4_ >> 0xc;
    iVar21 = auVar24._0_4_ + auVar66._0_4_ + iVar44 >> 0xc;
    iVar25 = auVar24._4_4_ + auVar66._4_4_ + iVar46 >> 0xc;
    iVar26 = auVar24._8_4_ + auVar66._8_4_ + iVar47 >> 0xc;
    iVar27 = auVar24._12_4_ + auVar66._12_4_ + iVar48 >> 0xc;
    auVar22._8_4_ = 0xec8;
    auVar22._0_8_ = 0xec800000ec8;
    auVar22._12_4_ = 0xec8;
    auVar10 = pmulld(auVar2,auVar22);
    auVar14._8_4_ = 0x61f;
    auVar14._0_8_ = 0x61f0000061f;
    auVar14._12_4_ = 0x61f;
    auVar40 = pmulld(auVar40,auVar14);
    iVar39 = auVar40._0_4_ + auVar10._0_4_ + iVar44 >> 0xc;
    iVar41 = auVar40._4_4_ + auVar10._4_4_ + iVar46 >> 0xc;
    iVar42 = auVar40._8_4_ + auVar10._8_4_ + iVar47 >> 0xc;
    iVar43 = auVar40._12_4_ + auVar10._12_4_ + iVar48 >> 0xc;
    iVar63 = iVar28 + iVar12;
    iVar67 = iVar31 + iVar15;
    iVar70 = iVar32 + iVar17;
    iVar73 = iVar33 + iVar19;
    iVar12 = iVar12 - iVar28;
    iVar15 = iVar15 - iVar31;
    iVar17 = iVar17 - iVar32;
    iVar19 = iVar19 - iVar33;
    uVar13 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
    uVar16 = (uint)(iVar15 < iVar9) * iVar9 | (uint)(iVar15 >= iVar9) * iVar15;
    uVar18 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
    uVar20 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
    auVar29._0_4_ = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    auVar29._4_4_ = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    auVar29._8_4_ = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    auVar29._12_4_ = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    iVar12 = iVar34 + iVar49;
    iVar15 = iVar36 + iVar53;
    iVar17 = iVar37 + iVar55;
    iVar19 = iVar38 + iVar57;
    iVar49 = iVar49 - iVar34;
    iVar53 = iVar53 - iVar36;
    iVar55 = iVar55 - iVar37;
    iVar57 = iVar57 - iVar38;
    uVar13 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
    uVar16 = (uint)(iVar15 < iVar9) * iVar9 | (uint)(iVar15 >= iVar9) * iVar15;
    uVar18 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
    uVar20 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
    uVar13 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    uVar16 = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    uVar18 = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    uVar20 = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    uVar50 = (uint)(iVar49 < iVar9) * iVar9 | (uint)(iVar49 >= iVar9) * iVar49;
    uVar54 = (uint)(iVar53 < iVar9) * iVar9 | (uint)(iVar53 >= iVar9) * iVar53;
    uVar56 = (uint)(iVar55 < iVar9) * iVar9 | (uint)(iVar55 >= iVar9) * iVar55;
    uVar58 = (uint)(iVar57 < iVar9) * iVar9 | (uint)(iVar57 >= iVar9) * iVar57;
    auVar52._0_4_ = (uint)(iVar7 < (int)uVar50) * iVar7 | (iVar7 >= (int)uVar50) * uVar50;
    auVar52._4_4_ = (uint)(iVar7 < (int)uVar54) * iVar7 | (iVar7 >= (int)uVar54) * uVar54;
    auVar52._8_4_ = (uint)(iVar7 < (int)uVar56) * iVar7 | (iVar7 >= (int)uVar56) * uVar56;
    auVar52._12_4_ = (uint)(iVar7 < (int)uVar58) * iVar7 | (iVar7 >= (int)uVar58) * uVar58;
    iVar12 = iVar39 + iVar59;
    iVar15 = iVar41 + iVar60;
    iVar17 = iVar42 + iVar61;
    iVar19 = iVar43 + iVar62;
    iVar59 = iVar59 - iVar39;
    iVar60 = iVar60 - iVar41;
    iVar61 = iVar61 - iVar42;
    iVar62 = iVar62 - iVar43;
    uVar50 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
    uVar54 = (uint)(iVar15 < iVar9) * iVar9 | (uint)(iVar15 >= iVar9) * iVar15;
    uVar56 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
    uVar58 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
    uVar50 = (uint)(iVar7 < (int)uVar50) * iVar7 | (iVar7 >= (int)uVar50) * uVar50;
    uVar54 = (uint)(iVar7 < (int)uVar54) * iVar7 | (iVar7 >= (int)uVar54) * uVar54;
    uVar56 = (uint)(iVar7 < (int)uVar56) * iVar7 | (iVar7 >= (int)uVar56) * uVar56;
    uVar58 = (uint)(iVar7 < (int)uVar58) * iVar7 | (iVar7 >= (int)uVar58) * uVar58;
    iVar28 = iVar21 + iVar64;
    iVar31 = iVar25 + iVar68;
    iVar32 = iVar26 + iVar71;
    iVar33 = iVar27 + iVar74;
    iVar64 = iVar64 - iVar21;
    iVar68 = iVar68 - iVar25;
    iVar71 = iVar71 - iVar26;
    iVar74 = iVar74 - iVar27;
    auVar40._8_4_ = 0xb50;
    auVar40._0_8_ = 0xb5000000b50;
    auVar40._12_4_ = 0xb50;
    auVar40 = pmulld(auVar29,auVar40);
    auVar2._8_4_ = 0xb50;
    auVar2._0_8_ = 0xb5000000b50;
    auVar2._12_4_ = 0xb50;
    auVar10 = pmulld(auVar52,auVar2);
    iVar12 = uVar13 + uVar50;
    iVar15 = uVar16 + uVar54;
    iVar17 = uVar18 + uVar56;
    iVar19 = uVar20 + uVar58;
    iVar34 = uVar50 - uVar13;
    iVar36 = uVar54 - uVar16;
    iVar37 = uVar56 - uVar18;
    iVar38 = uVar58 - uVar20;
    uVar13 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
    uVar16 = (uint)(iVar15 < iVar9) * iVar9 | (uint)(iVar15 >= iVar9) * iVar15;
    uVar18 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
    uVar20 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
    puVar1 = (uint *)((long)*out + lVar8);
    *puVar1 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    puVar1[1] = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    puVar1[2] = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    puVar1[3] = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    uVar13 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
    uVar16 = (uint)(iVar31 < iVar9) * iVar9 | (uint)(iVar31 >= iVar9) * iVar31;
    uVar18 = (uint)(iVar32 < iVar9) * iVar9 | (uint)(iVar32 >= iVar9) * iVar32;
    uVar20 = (uint)(iVar33 < iVar9) * iVar9 | (uint)(iVar33 >= iVar9) * iVar33;
    uVar13 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    uVar16 = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    uVar18 = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    uVar20 = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    iVar21 = auVar40._0_4_ + auVar10._0_4_ + iVar44 >> 0xc;
    iVar25 = auVar40._4_4_ + auVar10._4_4_ + iVar46 >> 0xc;
    iVar26 = auVar40._8_4_ + auVar10._8_4_ + iVar47 >> 0xc;
    iVar27 = auVar40._12_4_ + auVar10._12_4_ + iVar48 >> 0xc;
    uVar50 = (uint)(iVar34 < iVar9) * iVar9 | (uint)(iVar34 >= iVar9) * iVar34;
    uVar54 = (uint)(iVar36 < iVar9) * iVar9 | (uint)(iVar36 >= iVar9) * iVar36;
    uVar56 = (uint)(iVar37 < iVar9) * iVar9 | (uint)(iVar37 >= iVar9) * iVar37;
    uVar58 = (uint)(iVar38 < iVar9) * iVar9 | (uint)(iVar38 >= iVar9) * iVar38;
    puVar1 = (uint *)((long)out[0xe] + lVar8);
    *puVar1 = (uint)(iVar7 < (int)uVar50) * iVar7 | (iVar7 >= (int)uVar50) * uVar50;
    puVar1[1] = (uint)(iVar7 < (int)uVar54) * iVar7 | (iVar7 >= (int)uVar54) * uVar54;
    puVar1[2] = (uint)(iVar7 < (int)uVar56) * iVar7 | (iVar7 >= (int)uVar56) * uVar56;
    puVar1[3] = (uint)(iVar7 < (int)uVar58) * iVar7 | (iVar7 >= (int)uVar58) * uVar58;
    iVar12 = iVar21 + uVar13;
    iVar15 = iVar25 + uVar16;
    iVar17 = iVar26 + uVar18;
    iVar19 = iVar27 + uVar20;
    iVar21 = uVar13 - iVar21;
    iVar25 = uVar16 - iVar25;
    iVar26 = uVar18 - iVar26;
    iVar27 = uVar20 - iVar27;
    uVar13 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
    uVar16 = (uint)(iVar15 < iVar9) * iVar9 | (uint)(iVar15 >= iVar9) * iVar15;
    uVar18 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
    uVar20 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
    puVar1 = (uint *)((long)out[2] + lVar8);
    *puVar1 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    puVar1[1] = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    puVar1[2] = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    puVar1[3] = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    uVar13 = (uint)(iVar64 < iVar9) * iVar9 | (uint)(iVar64 >= iVar9) * iVar64;
    uVar16 = (uint)(iVar68 < iVar9) * iVar9 | (uint)(iVar68 >= iVar9) * iVar68;
    uVar18 = (uint)(iVar71 < iVar9) * iVar9 | (uint)(iVar71 >= iVar9) * iVar71;
    uVar20 = (uint)(iVar74 < iVar9) * iVar9 | (uint)(iVar74 >= iVar9) * iVar74;
    uVar50 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    uVar54 = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    uVar56 = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    uVar58 = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    iVar28 = (auVar10._0_4_ - auVar40._0_4_) + iVar44 >> 0xc;
    iVar31 = (auVar10._4_4_ - auVar40._4_4_) + iVar46 >> 0xc;
    iVar32 = (auVar10._8_4_ - auVar40._8_4_) + iVar47 >> 0xc;
    iVar33 = (auVar10._12_4_ - auVar40._12_4_) + iVar48 >> 0xc;
    uVar13 = (uint)(iVar21 < iVar9) * iVar9 | (uint)(iVar21 >= iVar9) * iVar21;
    uVar16 = (uint)(iVar25 < iVar9) * iVar9 | (uint)(iVar25 >= iVar9) * iVar25;
    uVar18 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
    uVar20 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
    puVar1 = (uint *)((long)out[0xc] + lVar8);
    *puVar1 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    puVar1[1] = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    puVar1[2] = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    puVar1[3] = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    iVar12 = iVar28 + uVar50;
    iVar15 = iVar31 + uVar54;
    iVar17 = iVar32 + uVar56;
    iVar19 = iVar33 + uVar58;
    iVar28 = uVar50 - iVar28;
    iVar31 = uVar54 - iVar31;
    iVar32 = uVar56 - iVar32;
    iVar33 = uVar58 - iVar33;
    uVar13 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
    uVar16 = (uint)(iVar15 < iVar9) * iVar9 | (uint)(iVar15 >= iVar9) * iVar15;
    uVar18 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
    uVar20 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
    puVar1 = (uint *)((long)out[4] + lVar8);
    *puVar1 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    puVar1[1] = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    puVar1[2] = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    puVar1[3] = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    uVar13 = (uint)(iVar63 < iVar9) * iVar9 | (uint)(iVar63 >= iVar9) * iVar63;
    uVar16 = (uint)(iVar67 < iVar9) * iVar9 | (uint)(iVar67 >= iVar9) * iVar67;
    uVar18 = (uint)(iVar70 < iVar9) * iVar9 | (uint)(iVar70 >= iVar9) * iVar70;
    uVar20 = (uint)(iVar73 < iVar9) * iVar9 | (uint)(iVar73 >= iVar9) * iVar73;
    uVar13 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    uVar16 = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    uVar18 = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    uVar20 = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    uVar50 = (uint)(iVar59 < iVar9) * iVar9 | (uint)(iVar59 >= iVar9) * iVar59;
    uVar54 = (uint)(iVar60 < iVar9) * iVar9 | (uint)(iVar60 >= iVar9) * iVar60;
    uVar56 = (uint)(iVar61 < iVar9) * iVar9 | (uint)(iVar61 >= iVar9) * iVar61;
    uVar58 = (uint)(iVar62 < iVar9) * iVar9 | (uint)(iVar62 >= iVar9) * iVar62;
    uVar50 = (uint)(iVar7 < (int)uVar50) * iVar7 | (iVar7 >= (int)uVar50) * uVar50;
    uVar54 = (uint)(iVar7 < (int)uVar54) * iVar7 | (iVar7 >= (int)uVar54) * uVar54;
    uVar56 = (uint)(iVar7 < (int)uVar56) * iVar7 | (iVar7 >= (int)uVar56) * uVar56;
    uVar58 = (uint)(iVar7 < (int)uVar58) * iVar7 | (iVar7 >= (int)uVar58) * uVar58;
    uVar65 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
    uVar69 = (uint)(iVar31 < iVar9) * iVar9 | (uint)(iVar31 >= iVar9) * iVar31;
    uVar72 = (uint)(iVar32 < iVar9) * iVar9 | (uint)(iVar32 >= iVar9) * iVar32;
    uVar75 = (uint)(iVar33 < iVar9) * iVar9 | (uint)(iVar33 >= iVar9) * iVar33;
    puVar1 = (uint *)((long)out[10] + lVar8);
    *puVar1 = (uint)(iVar7 < (int)uVar65) * iVar7 | (iVar7 >= (int)uVar65) * uVar65;
    puVar1[1] = (uint)(iVar7 < (int)uVar69) * iVar7 | (iVar7 >= (int)uVar69) * uVar69;
    puVar1[2] = (uint)(iVar7 < (int)uVar72) * iVar7 | (iVar7 >= (int)uVar72) * uVar72;
    puVar1[3] = (uint)(iVar7 < (int)uVar75) * iVar7 | (iVar7 >= (int)uVar75) * uVar75;
    iVar12 = uVar13 + uVar50;
    iVar15 = uVar16 + uVar54;
    iVar17 = uVar18 + uVar56;
    iVar19 = uVar20 + uVar58;
    iVar63 = uVar50 - uVar13;
    iVar67 = uVar54 - uVar16;
    iVar70 = uVar56 - uVar18;
    iVar73 = uVar58 - uVar20;
    uVar13 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
    uVar16 = (uint)(iVar15 < iVar9) * iVar9 | (uint)(iVar15 >= iVar9) * iVar15;
    uVar18 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
    uVar20 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
    puVar1 = (uint *)((long)out[6] + lVar8);
    *puVar1 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    puVar1[1] = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    puVar1[2] = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    puVar1[3] = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    uVar13 = (uint)(iVar63 < iVar9) * iVar9 | (uint)(iVar63 >= iVar9) * iVar63;
    uVar16 = (uint)(iVar67 < iVar9) * iVar9 | (uint)(iVar67 >= iVar9) * iVar67;
    uVar18 = (uint)(iVar70 < iVar9) * iVar9 | (uint)(iVar70 >= iVar9) * iVar70;
    uVar20 = (uint)(iVar73 < iVar9) * iVar9 | (uint)(iVar73 >= iVar9) * iVar73;
    puVar1 = (uint *)((long)out[8] + lVar8);
    *puVar1 = (uint)(iVar7 < (int)uVar13) * iVar7 | (iVar7 >= (int)uVar13) * uVar13;
    puVar1[1] = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    puVar1[2] = (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    puVar1[3] = (uint)(iVar7 < (int)uVar20) * iVar7 | (iVar7 >= (int)uVar20) * uVar20;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 == 0x10);
  if (bit == 0) {
    bVar6 = 10;
    if (10 < do_cols) {
      bVar6 = (byte)do_cols;
    }
    local_38 = 0x20 << (bVar6 & 0x1f);
    local_28 = -local_38;
    local_38 = local_38 + -1;
    iStack_34 = local_38;
    iStack_30 = local_38;
    iStack_2c = local_38;
    iStack_24 = local_28;
    iStack_20 = local_28;
    iStack_1c = local_28;
    round_shift_8x8(out,bd);
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_28,(__m128i *)&local_38,0x10);
  }
  return;
}

Assistant:

static void idct8x8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                           int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;
  int col;

  // Note:
  //  Even column: 0, 2, ..., 14
  //  Odd column: 1, 3, ..., 15
  //  one even column plus one odd column constructs one row (8 coeffs)
  //  total we have 8 rows (8x8).
  for (col = 0; col < 2; ++col) {
    // stage 0
    // stage 1
    // stage 2
    u0 = in[0 * 2 + col];
    u1 = in[4 * 2 + col];
    u2 = in[2 * 2 + col];
    u3 = in[6 * 2 + col];

    x = _mm_mullo_epi32(in[1 * 2 + col], cospi56);
    y = _mm_mullo_epi32(in[7 * 2 + col], cospim8);
    u4 = _mm_add_epi32(x, y);
    u4 = _mm_add_epi32(u4, rnding);
    u4 = _mm_srai_epi32(u4, bit);

    x = _mm_mullo_epi32(in[1 * 2 + col], cospi8);
    y = _mm_mullo_epi32(in[7 * 2 + col], cospi56);
    u7 = _mm_add_epi32(x, y);
    u7 = _mm_add_epi32(u7, rnding);
    u7 = _mm_srai_epi32(u7, bit);

    x = _mm_mullo_epi32(in[5 * 2 + col], cospi24);
    y = _mm_mullo_epi32(in[3 * 2 + col], cospim40);
    u5 = _mm_add_epi32(x, y);
    u5 = _mm_add_epi32(u5, rnding);
    u5 = _mm_srai_epi32(u5, bit);

    x = _mm_mullo_epi32(in[5 * 2 + col], cospi40);
    y = _mm_mullo_epi32(in[3 * 2 + col], cospi24);
    u6 = _mm_add_epi32(x, y);
    u6 = _mm_add_epi32(u6, rnding);
    u6 = _mm_srai_epi32(u6, bit);

    // stage 3
    x = _mm_mullo_epi32(u0, cospi32);
    y = _mm_mullo_epi32(u1, cospi32);
    v0 = _mm_add_epi32(x, y);
    v0 = _mm_add_epi32(v0, rnding);
    v0 = _mm_srai_epi32(v0, bit);

    v1 = _mm_sub_epi32(x, y);
    v1 = _mm_add_epi32(v1, rnding);
    v1 = _mm_srai_epi32(v1, bit);

    x = _mm_mullo_epi32(u2, cospi48);
    y = _mm_mullo_epi32(u3, cospim16);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    x = _mm_mullo_epi32(u2, cospi16);
    y = _mm_mullo_epi32(u3, cospi48);
    v3 = _mm_add_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    addsub_sse4_1(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
    addsub_sse4_1(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

    // stage 4
    addsub_sse4_1(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
    u4 = v4;
    u7 = v7;

    x = _mm_mullo_epi32(v5, cospi32);
    y = _mm_mullo_epi32(v6, cospi32);
    u6 = _mm_add_epi32(y, x);
    u6 = _mm_add_epi32(u6, rnding);
    u6 = _mm_srai_epi32(u6, bit);

    u5 = _mm_sub_epi32(y, x);
    u5 = _mm_add_epi32(u5, rnding);
    u5 = _mm_srai_epi32(u5, bit);

    // stage 5
    addsub_sse4_1(u0, u7, out + 0 * 2 + col, out + 7 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u1, u6, out + 1 * 2 + col, out + 6 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u2, u5, out + 2 * 2 + col, out + 5 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u3, u4, out + 3 * 2 + col, out + 4 * 2 + col, &clamp_lo,
                  &clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
  }
}